

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprNodeIsConstantOrGroupBy(Walker *pWalker,Expr *pExpr)

{
  SrcList *pSVar1;
  Schema *pB;
  int iVar2;
  CollSeq *pCVar3;
  CollSeq *pColl;
  Expr *p;
  int i;
  ExprList *pGroupBy;
  Expr *pExpr_local;
  Walker *pWalker_local;
  
  pSVar1 = (pWalker->u).pSrcList;
  p._4_4_ = 0;
  while( true ) {
    if (pSVar1->nSrc <= p._4_4_) {
      if ((pExpr->flags & 0x800) == 0) {
        pWalker_local._4_4_ = exprNodeIsConstant(pWalker,pExpr);
      }
      else {
        pWalker->eCode = '\0';
        pWalker_local._4_4_ = 2;
      }
      return pWalker_local._4_4_;
    }
    pB = (&pSVar1->a[0].pSchema)[(long)p._4_4_ * 4];
    iVar2 = sqlite3ExprCompare((Parse *)0x0,pExpr,(Expr *)pB,-1);
    if ((iVar2 < 2) &&
       ((pCVar3 = sqlite3ExprCollSeq(pWalker->pParse,(Expr *)pB), pCVar3 == (CollSeq *)0x0 ||
        (iVar2 = sqlite3_stricmp("BINARY",pCVar3->zName), iVar2 == 0)))) break;
    p._4_4_ = p._4_4_ + 1;
  }
  return 1;
}

Assistant:

static int exprNodeIsConstantOrGroupBy(Walker *pWalker, Expr *pExpr){
  ExprList *pGroupBy = pWalker->u.pGroupBy;
  int i;

  /* Check if pExpr is identical to any GROUP BY term. If so, consider
  ** it constant.  */
  for(i=0; i<pGroupBy->nExpr; i++){
    Expr *p = pGroupBy->a[i].pExpr;
    if( sqlite3ExprCompare(0, pExpr, p, -1)<2 ){
      CollSeq *pColl = sqlite3ExprCollSeq(pWalker->pParse, p);
      if( pColl==0 || sqlite3_stricmp("BINARY", pColl->zName)==0 ){
        return WRC_Prune;
      }
    }
  }

  /* Check if pExpr is a sub-select. If so, consider it variable. */
  if( ExprHasProperty(pExpr, EP_xIsSelect) ){
    pWalker->eCode = 0;
    return WRC_Abort;
  }

  return exprNodeIsConstant(pWalker, pExpr);
}